

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::resolve
          (PromiseClient *this,Own<capnp::ClientHook> *replacement,bool isError)

{
  RpcConnectionState *pRVar1;
  undefined8 *puVar2;
  uint *puVar3;
  PromiseFulfiller<void> *pPVar4;
  Builder target;
  int iVar5;
  undefined4 extraout_var;
  TransformPromiseNodeBase *this_00;
  Embargo *pEVar6;
  ulong capacity;
  Own<kj::PromiseFulfiller<void>_> *pOVar7;
  Embargo *pEVar8;
  ulong uVar9;
  Own<kj::PromiseFulfiller<void>_> *pOVar10;
  Fault f;
  Own<capnp::ClientHook> OStack_110;
  PromiseFulfillerPair<void> paf;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:986:40),_kj::Own<capnp::ClientHook>_>,_void>
  embargoPromise;
  Own<capnp::OutgoingRpcMessage> message;
  Own<kj::_::PromiseNode> local_a0;
  Builder local_90;
  Builder disembargo;
  Own<kj::_::PromiseNode> local_40;
  
  iVar5 = (*replacement->ptr->_vptr_ClientHook[5])();
  pRVar1 = (this->super_RpcClient).connectionState.ptr;
  if ((((RpcConnectionState *)CONCAT44(extraout_var,iVar5) !=
        (RpcConnectionState *)&ClientHook::NULL_CAPABILITY_BRAND &&
        (RpcConnectionState *)CONCAT44(extraout_var,iVar5) != pRVar1) &&
      (this->receivedCall == true && !isError)) && ((pRVar1->connection).tag == 1)) {
    puVar2 = *(undefined8 **)((long)&(pRVar1->connection).field_1 + 8);
    (**(code **)*puVar2)(&message,puVar2,0x19);
    (**(message.ptr)->_vptr_OutgoingRpcMessage)(&f);
    AnyPointer::Builder::initAs<capnp::rpc::Message>
              ((BuilderFor<capnp::rpc::Message> *)&paf,(Builder *)&f);
    rpc::Message::Builder::initDisembargo(&disembargo,(Builder *)&paf);
    pRVar1 = (this->super_RpcClient).connectionState.ptr;
    rpc::Disembargo::Builder::initTarget(&local_90,&disembargo);
    target._builder.capTable = local_90._builder.capTable;
    target._builder.segment = local_90._builder.segment;
    target._builder.data = local_90._builder.data;
    target._builder.pointers = local_90._builder.pointers;
    target._builder.dataSize = local_90._builder.dataSize;
    target._builder.pointerCount = local_90._builder.pointerCount;
    target._builder._38_2_ = local_90._builder._38_2_;
    RpcConnectionState::writeTarget((RpcConnectionState *)&paf,(ClientHook *)pRVar1,target);
    if (paf.promise.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x3cd,FAILED,"redirect == nullptr",
                 "\"Original promise target should always be from this RPC connection.\"",
                 (char (*) [67])"Original promise target should always be from this RPC connection."
                );
      kj::_::Debug::Fault::fatal(&f);
    }
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&paf);
    pRVar1 = (this->super_RpcClient).connectionState.ptr;
    puVar3 = (pRVar1->embargoes).freeIds.c.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar3 == (pRVar1->embargoes).freeIds.c.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pEVar6 = (pRVar1->embargoes).slots.builder.ptr;
      pEVar8 = (pRVar1->embargoes).slots.builder.pos;
      uVar9 = (long)pEVar8 - (long)pEVar6 >> 4;
      if (pEVar8 == (pRVar1->embargoes).slots.builder.endPtr) {
        capacity = 4;
        if (pEVar8 != pEVar6) {
          capacity = (long)pEVar8 - (long)pEVar6 >> 3;
        }
        if (capacity < uVar9) {
          while (pEVar6 + capacity < pEVar8) {
            (pRVar1->embargoes).slots.builder.pos =
                 (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)
                 (pEVar8 + -1);
            kj::Own<kj::PromiseFulfiller<void>_>::dispose
                      ((Own<kj::PromiseFulfiller<void>_> *)(pEVar8 + -1));
            pEVar8 = (pRVar1->embargoes).slots.builder.pos;
          }
        }
        paf.promise.super_PromiseBase.node.disposer =
             (Disposer *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x10,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        paf.fulfiller.disposer =
             (Disposer *)((long)paf.promise.super_PromiseBase.node.disposer + capacity * 0x10);
        paf.fulfiller.ptr = (PromiseFulfiller<void> *)&kj::_::HeapArrayDisposer::instance;
        pEVar8 = (pRVar1->embargoes).slots.builder.pos;
        pOVar10 = (Own<kj::PromiseFulfiller<void>_> *)paf.promise.super_PromiseBase.node.disposer;
        for (pEVar6 = (pRVar1->embargoes).slots.builder.ptr; pOVar7 = pOVar10,
            paf.promise.super_PromiseBase.node.ptr =
                 (PromiseNode *)paf.promise.super_PromiseBase.node.disposer, pEVar6 != pEVar8;
            pEVar6 = pEVar6 + 1) {
          pPVar4 = (pEVar6->fulfiller).ptr.ptr;
          pOVar10->disposer = (pEVar6->fulfiller).ptr.disposer;
          pOVar10->ptr = pPVar4;
          (pEVar6->fulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
          pOVar10 = pOVar10 + 1;
        }
        while (pOVar10 < pOVar7) {
          kj::Own<kj::PromiseFulfiller<void>_>::dispose(pOVar7 + -1);
          pOVar7 = pOVar7 + -1;
        }
        paf.promise.super_PromiseBase.node.ptr = (PromiseNode *)pOVar10;
        kj::ArrayBuilder<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>::dispose
                  ((ArrayBuilder<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)
                   &pRVar1->embargoes);
        (pRVar1->embargoes).slots.builder.ptr =
             (Embargo *)paf.promise.super_PromiseBase.node.disposer;
        (pRVar1->embargoes).slots.builder.pos =
             (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)pOVar10;
        (pRVar1->embargoes).slots.builder.endPtr = (Embargo *)paf.fulfiller.disposer;
        (pRVar1->embargoes).slots.builder.disposer = (ArrayDisposer *)paf.fulfiller.ptr;
        paf.promise.super_PromiseBase.node.disposer = (Disposer *)0x0;
        paf.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        paf.fulfiller.disposer = (Disposer *)0x0;
        kj::ArrayBuilder<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo>::dispose
                  ((ArrayBuilder<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)
                   &paf);
        pEVar8 = (pRVar1->embargoes).slots.builder.pos;
      }
      (pEVar8->fulfiller).ptr.disposer = (Disposer *)0x0;
      (pEVar8->fulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
      pOVar10 = (Own<kj::PromiseFulfiller<void>_> *)(pRVar1->embargoes).slots.builder.pos;
      (pRVar1->embargoes).slots.builder.pos =
           (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)
           (pOVar10 + 1);
    }
    else {
      uVar9 = (ulong)*puVar3;
      std::
      priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
      ::pop(&(pRVar1->embargoes).freeIds);
      pOVar10 = (Own<kj::PromiseFulfiller<void>_> *)((pRVar1->embargoes).slots.builder.ptr + uVar9);
    }
    *(undefined2 *)((long)disembargo._builder.data + 4) = 0;
    *(int *)disembargo._builder.data = (int)uVar9;
    kj::newPromiseAndFulfiller<void>();
    f.exception = (Exception *)paf.fulfiller.disposer;
    OStack_110.disposer = (Disposer *)paf.fulfiller.ptr;
    paf.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
    kj::Own<kj::PromiseFulfiller<void>_>::operator=(pOVar10,(Own<kj::PromiseFulfiller<void>_> *)&f);
    kj::Own<kj::PromiseFulfiller<void>_>::dispose((Own<kj::PromiseFulfiller<void>_> *)&f);
    OStack_110.disposer = replacement->disposer;
    OStack_110.ptr = replacement->ptr;
    replacement->ptr = (ClientHook *)0x0;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&paf,
               kj::
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:986:40),_kj::Own<capnp::ClientHook>_>
               ::operator()<>);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0066fd78;
    this_00[1].dependency.disposer = OStack_110.disposer;
    this_00[1].dependency.ptr = (PromiseNode *)OStack_110.ptr;
    OStack_110.ptr = (ClientHook *)0x0;
    local_a0.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::PromiseClient::resolve(kj::Own<capnp::ClientHook>,bool)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
          ::instance;
    local_40.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::PromiseClient::resolve(kj::Own<capnp::ClientHook>,bool)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
          ::instance;
    local_a0.ptr = (PromiseNode *)0x0;
    embargoPromise.super_PromiseBase.node.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::PromiseClient::resolve(kj::Own<capnp::ClientHook>,bool)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
          ::instance;
    local_40.ptr = (PromiseNode *)0x0;
    embargoPromise.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
    kj::Own<kj::_::PromiseNode>::dispose(&local_40);
    kj::Own<kj::_::PromiseNode>::dispose(&local_a0);
    kj::Own<capnp::ClientHook>::dispose(&OStack_110);
    newLocalPromiseClient((capnp *)&f,&embargoPromise);
    kj::Own<capnp::ClientHook>::operator=(replacement,(Own<capnp::ClientHook> *)&f);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&f);
    (*(message.ptr)->_vptr_OutgoingRpcMessage[1])();
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&embargoPromise);
    kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair(&paf);
    kj::Own<capnp::OutgoingRpcMessage>::dispose(&message);
  }
  kj::Own<capnp::ClientHook>::operator=(&this->cap,replacement);
  this->isResolved = true;
  return;
}

Assistant:

void resolve(kj::Own<ClientHook> replacement, bool isError) {
      const void* replacementBrand = replacement->getBrand();
      if (replacementBrand != connectionState.get() &&
          replacementBrand != &ClientHook::NULL_CAPABILITY_BRAND &&
          receivedCall && !isError && connectionState->connection.is<Connected>()) {
        // The new capability is hosted locally, not on the remote machine.  And, we had made calls
        // to the promise.  We need to make sure those calls echo back to us before we allow new
        // calls to go directly to the local capability, so we need to set a local embargo and send
        // a `Disembargo` to echo through the peer.

        auto message = connectionState->connection.get<Connected>()->newOutgoingMessage(
            messageSizeHint<rpc::Disembargo>() + MESSAGE_TARGET_SIZE_HINT);

        auto disembargo = message->getBody().initAs<rpc::Message>().initDisembargo();

        {
          auto redirect = connectionState->writeTarget(*cap, disembargo.initTarget());
          KJ_ASSERT(redirect == nullptr,
                    "Original promise target should always be from this RPC connection.");
        }

        EmbargoId embargoId;
        Embargo& embargo = connectionState->embargoes.next(embargoId);

        disembargo.getContext().setSenderLoopback(embargoId);

        auto paf = kj::newPromiseAndFulfiller<void>();
        embargo.fulfiller = kj::mv(paf.fulfiller);

        // Make a promise which resolves to `replacement` as soon as the `Disembargo` comes back.
        auto embargoPromise = paf.promise.then(
            kj::mvCapture(replacement, [](kj::Own<ClientHook>&& replacement) {
              return kj::mv(replacement);
            }));

        // We need to queue up calls in the meantime, so we'll resolve ourselves to a local promise
        // client instead.
        replacement = newLocalPromiseClient(kj::mv(embargoPromise));

        // Send the `Disembargo`.
        message->send();
      }

      cap = kj::mv(replacement);
      isResolved = true;
    }